

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O0

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  uint local_58;
  uint local_54;
  uint component2;
  int component1;
  size_t i;
  size_t sStack_40;
  uint value;
  size_t n;
  char *p;
  int ret;
  mbedtls_asn1_buf *oid_local;
  size_t size_local;
  char *buf_local;
  
  i._4_4_ = 0;
  if (size < 0x80000000) {
    if (oid->len == 0) {
      buf_local._4_4_ = -0x60;
    }
    else {
      sStack_40 = size;
      n = (size_t)buf;
      for (_component2 = 0; _component2 < oid->len; _component2 = _component2 + 1) {
        if (0x1ffffff < i._4_4_) {
          return -0x68;
        }
        if ((i._4_4_ == 0) && (oid->p[_component2] == 0x80)) {
          return -0x68;
        }
        local_58 = oid->p[_component2] & 0x7f | i._4_4_ << 7;
        i._4_4_ = local_58;
        if ((oid->p[_component2] & 0x80) == 0) {
          if (sStack_40 == size) {
            if (local_58 < 0x50) {
              if (local_58 < 0x28) {
                local_54 = 0x30;
              }
              else {
                local_54 = 0x31;
                local_58 = local_58 - 0x28;
              }
            }
            else {
              local_54 = 0x32;
              local_58 = local_58 - 0x50;
            }
            p._4_4_ = snprintf((char *)n,sStack_40,"%c.%u",(ulong)local_54,(ulong)local_58);
          }
          else {
            p._4_4_ = snprintf((char *)n,sStack_40,".%u",(ulong)local_58);
          }
          if ((p._4_4_ < 2) || (sStack_40 <= (ulong)(long)p._4_4_)) {
            return -0xb;
          }
          sStack_40 = sStack_40 - (long)p._4_4_;
          n = n + (long)p._4_4_;
          i._4_4_ = 0;
        }
      }
      if (i._4_4_ == 0) {
        buf_local._4_4_ = (int)size - (int)sStack_40;
      }
      else {
        buf_local._4_4_ = -0x60;
      }
    }
  }
  else {
    buf_local._4_4_ = -100;
  }
  return buf_local._4_4_;
}

Assistant:

int mbedtls_oid_get_numeric_string(char *buf, size_t size,
                                   const mbedtls_asn1_buf *oid)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    unsigned int value = 0;

    if (size > INT_MAX) {
        /* Avoid overflow computing return value */
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    if (oid->len <= 0) {
        /* OID must not be empty */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    for (size_t i = 0; i < oid->len; i++) {
        /* Prevent overflow in value. */
        if (value > (UINT_MAX >> 7)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        if ((value == 0) && ((oid->p[i]) == 0x80)) {
            /* Overlong encoding is not allowed */
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }

        value <<= 7;
        value |= oid->p[i] & 0x7F;

        if (!(oid->p[i] & 0x80)) {
            /* Last byte */
            if (n == size) {
                int component1;
                unsigned int component2;
                /* First subidentifier contains first two OID components */
                if (value >= 80) {
                    component1 = '2';
                    component2 = value - 80;
                } else if (value >= 40) {
                    component1 = '1';
                    component2 = value - 40;
                } else {
                    component1 = '0';
                    component2 = value;
                }
                ret = mbedtls_snprintf(p, n, "%c.%u", component1, component2);
            } else {
                ret = mbedtls_snprintf(p, n, ".%u", value);
            }
            if (ret < 2 || (size_t) ret >= n) {
                return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
            }
            n -= (size_t) ret;
            p += ret;
            value = 0;
        }
    }

    if (value != 0) {
        /* Unterminated subidentifier */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return (int) (size - n);
}